

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFloat16.c
# Opt level: O0

float deFloat16To32(deFloat16 val16)

{
  uint uVar1;
  uint local_1c;
  anon_union_4_2_947300b0 x;
  deUint32 mantissa;
  deUint32 expotent;
  deUint32 sign;
  deFloat16 val16_local;
  
  uVar1 = (uint)(val16 >> 0xf);
  x.u = val16 >> 10 & 0x1f;
  local_1c = val16 & 0x3ff;
  if ((val16 >> 10 & 0x1f) == 0) {
    if ((val16 & 0x3ff) == 0) {
      return (float)(uVar1 << 0x1f);
    }
    for (; (local_1c & 0x400) == 0; local_1c = local_1c << 1) {
      x.u = x.u - 1;
    }
    x.u = x.u + 1;
    local_1c = local_1c & 0xfffffbff;
  }
  else if (x.u == 0x1f) {
    if ((val16 & 0x3ff) == 0) {
      return (float)(uVar1 << 0x1f | 0x7f800000);
    }
    return (float)(uVar1 << 0x1f | 0x7f800000 | local_1c << 0xd);
  }
  return (float)(uVar1 << 0x1f | (x.u + 0x70) * 0x800000 | local_1c << 0xd);
}

Assistant:

float deFloat16To32 (deFloat16 val16)
{
	deUint32 sign;
	deUint32 expotent;
	deUint32 mantissa;
	union
	{
		float		f;
		deUint32	u;
	} x;

	x.u			= 0u;

	sign		= ((deUint32)val16 >> 15u) & 0x00000001u;
	expotent	= ((deUint32)val16 >> 10u) & 0x0000001fu;
	mantissa	= (deUint32)val16 & 0x000003ffu;

	if (expotent == 0u)
	{
		if (mantissa == 0u)
		{
			/* +/- 0 */
			x.u = sign << 31u;
			return x.f;
		}
		else
		{
			/* Denormalized, normalize it. */

			while (!(mantissa & 0x00000400u))
			{
				mantissa <<= 1u;
				expotent -=  1u;
			}

			expotent += 1u;
			mantissa &= ~0x00000400u;
		}
	}
	else if (expotent == 31u)
	{
		if (mantissa == 0u)
		{
			/* +/- InF */
			x.u = (sign << 31u) | 0x7f800000u;
			return x.f;
		}
		else
		{
			/* +/- NaN */
			x.u = (sign << 31u) | 0x7f800000u | (mantissa << 13u);
			return x.f;
		}
	}

	expotent = expotent + (127u - 15u);
	mantissa = mantissa << 13u;

	x.u = (sign << 31u) | (expotent << 23u) | mantissa;
	return x.f;
}